

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableFill
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,TableFill *curr)

{
  Type type;
  Table *pTVar1;
  
  pTVar1 = Module::getTable(this->wasm,(Name)(curr->table).super_IString.str);
  type.id = (pTVar1->type).id;
  pTVar1 = Module::getTable(this->wasm,(Name)(curr->table).super_IString.str);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->dest,(Type)(pTVar1->addressType).id);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->value,type);
  pTVar1 = Module::getTable(this->wasm,(Name)(curr->table).super_IString.str);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->size,(Type)(pTVar1->addressType).id);
  return;
}

Assistant:

void visitTableFill(TableFill* curr) {
    auto type = wasm.getTable(curr->table)->type;
    noteTableIndex(&curr->dest, curr->table);
    note(&curr->value, type);
    noteTableIndex(&curr->size, curr->table);
  }